

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O0

void rsg::anon_unknown_0::convertExecValue(ExecConstValueAccess src,ExecValueAccess dst)

{
  ExecValueAccess EVar1;
  ExecConstValueAccess EVar2;
  Type TVar3;
  int iVar4;
  int iVar5;
  VariableType *pVVar6;
  undefined1 local_28 [8];
  ExecValueAccess dst_local;
  ExecConstValueAccess src_local;
  
  dst_local.super_ConstStridedValueAccess<64>.m_type =
       (VariableType *)dst.super_ConstStridedValueAccess<64>.m_value;
  local_28 = (undefined1  [8])dst.super_ConstStridedValueAccess<64>.m_type;
  dst_local.super_ConstStridedValueAccess<64>.m_value = (Scalar *)src.m_type;
  pVVar6 = ConstStridedValueAccess<64>::getType
                     ((ConstStridedValueAccess<64> *)
                      &dst_local.super_ConstStridedValueAccess<64>.m_value);
  TVar3 = VariableType::getBaseType(pVVar6);
  iVar4 = getBaseTypeConvNdx(TVar3);
  pVVar6 = ConstStridedValueAccess<64>::getType((ConstStridedValueAccess<64> *)local_28);
  TVar3 = VariableType::getBaseType(pVVar6);
  iVar5 = getBaseTypeConvNdx(TVar3);
  EVar2.m_value = src.m_value;
  EVar2.m_type = (VariableType *)dst_local.super_ConstStridedValueAccess<64>.m_value;
  EVar1.super_ConstStridedValueAccess<64>.m_value =
       (Scalar *)dst_local.super_ConstStridedValueAccess<64>.m_type;
  EVar1.super_ConstStridedValueAccess<64>.m_type = (VariableType *)local_28;
  (*convertExecValue::convTable[iVar4][iVar5])(EVar2,EVar1);
  return;
}

Assistant:

void convertExecValue (ExecConstValueAccess src, ExecValueAccess dst)
{
	// [src][dst]
	static const ConvertExecValueFunc convTable[3][3] =
	{
		{ convertExecValueTempl<float,	float>,	convertExecValueTempl<float,	int>,	convertExecValueTempl<float,	bool>	},
		{ convertExecValueTempl<int,	float>,	convertExecValueTempl<int,		int>,	convertExecValueTempl<int,		bool>	},
		{ convertExecValueTempl<bool,	float>,	convertExecValueTempl<bool,		int>,	convertExecValueTempl<bool,		bool>	}
	};

	convTable[getBaseTypeConvNdx(src.getType().getBaseType())][getBaseTypeConvNdx(dst.getType().getBaseType())](src, dst);
}